

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakelibraryinfo.cpp
# Opt level: O1

void QMakeLibraryInfo::sysrootify(QString *path)

{
  char16_t cVar1;
  char cVar2;
  char16_t *pcVar3;
  long in_FS_OFFSET;
  QString local_60;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  rawLocation(&local_60,0x15,FinalPaths);
  if (_DAT_0011a1c4 == 0) {
    QMetaType::registerHelper
              ((QMetaTypeInterface *)&QtPrivate::QMetaTypeInterfaceWrapper<QString>::metaType);
  }
  QVariant::moveConstruct
            ((QMetaTypeInterface *)&local_48,
             &QtPrivate::QMetaTypeInterfaceWrapper<QString>::metaType);
  cVar2 = QVariant::toBool();
  QVariant::~QVariant((QVariant *)&local_48);
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (cVar2 != '\0') {
    local_48.d.size = -0x5555555555555556;
    local_48.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_48.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    rawLocation(&local_48,0x14,FinalPaths);
    if (local_48.d.size != 0) {
      if ((((ulong)(path->d).size < 3) || (pcVar3 = (path->d).ptr, pcVar3[1] != L':')) ||
         ((cVar1 = pcVar3[2], cVar1 != L'\\' && (cVar1 != L'/')))) {
        pcVar3 = local_48.d.ptr;
        if (local_48.d.ptr == (char16_t *)0x0) {
          pcVar3 = (char16_t *)&QString::_empty;
        }
        QString::insert((longlong)path,(QChar *)0x0,(longlong)pcVar3);
      }
      else {
        QString::replace((longlong)path,0,(QString *)0x2);
      }
    }
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeLibraryInfo::sysrootify(QString &path)
{
    // Acceptable values for SysrootifyPrefixPath are "true" and "false"
    if (!QVariant::fromValue(rawLocation(SysrootifyPrefixPath, FinalPaths)).toBool())
        return;

    const QString sysroot = rawLocation(SysrootPath, FinalPaths);
    if (sysroot.isEmpty())
        return;

    if (path.size() > 2 && path.at(1) == QLatin1Char(':')
        && (path.at(2) == QLatin1Char('/') || path.at(2) == QLatin1Char('\\'))) {
        path.replace(0, 2, sysroot); // Strip out the drive on Windows targets
    } else {
        path.prepend(sysroot);
    }
}